

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

undefined8
rcg::getString_abi_cxx11_
          (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception,bool igncache)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  void *this;
  undefined8 uVar6;
  long *plVar7;
  int *piVar8;
  ostream *poVar9;
  invalid_argument *piVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  char *in_RDX;
  undefined8 in_RDI;
  byte in_R8B;
  double dVar11;
  GenericException *ex;
  IString *p_5;
  int i;
  uint8_t buffer [32];
  int len;
  IRegister *p_4;
  IEnumeration *p_3;
  IFloat *p_2;
  int64_t value;
  IInteger *p_1;
  IBoolean *p;
  INode *node;
  ostringstream out;
  IBase *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  gcstring *in_stack_fffffffffffff9d8;
  ostream *in_stack_fffffffffffff9e0;
  allocator *paVar12;
  long *local_608;
  long *local_5c8;
  long *local_5b0;
  long *local_598;
  long *local_488;
  long *local_470;
  allocator local_411;
  string local_410 [32];
  string local_3f0 [38];
  undefined1 local_3ca;
  allocator local_3c9;
  string local_3c8 [32];
  string local_3a8 [38];
  undefined1 local_382;
  allocator local_381;
  string local_380 [32];
  string local_360 [32];
  gcstring local_340 [80];
  long *local_2f0;
  int local_2e4;
  char local_2dd;
  int local_2dc;
  byte local_2d8 [44];
  int local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_2a0;
  gcstring local_298 [80];
  long *local_248;
  long *local_240;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  char local_219;
  ulong local_218;
  long *local_210;
  long *local_208;
  gcstring local_1f0 [80];
  long *local_1a0;
  ostringstream local_198 [382];
  byte local_1a;
  byte local_19;
  char *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_198);
  peVar5 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x131332);
  GenICam_3_4::gcstring::gcstring(local_1f0,local_18);
  iVar3 = (*(peVar5->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar5,local_1f0);
  plVar7 = (long *)CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring(local_1f0);
  local_1a0 = plVar7;
  if (plVar7 == (long *)0x0) {
    if ((local_19 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"Feature not found: ",&local_411);
      std::operator+(__lhs,(char *)in_stack_fffffffffffff9c0);
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_3f0);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    bVar1 = GenApi_3_4::IsReadable(in_stack_fffffffffffff9c0);
    if (bVar1) {
      uVar4 = (**(code **)(*local_1a0 + 0xf0))();
      switch(uVar4) {
      case 2:
        if (local_1a0 == (long *)0x0) {
          local_488 = (long *)0x0;
        }
        else {
          local_488 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        }
        local_210 = local_488;
        local_218 = (**(code **)(*local_488 + 0x48))(local_488,0,local_1a & 1);
        iVar3 = (**(code **)(*local_210 + 0x88))();
        if (iVar3 == 4) {
          this = (void *)std::ostream::operator<<(local_198,std::hex);
          std::ostream::operator<<(this,local_218);
        }
        else if (iVar3 == 5) {
          poVar9 = (ostream *)std::ostream::operator<<(local_198,local_218 >> 0x18 & 0xff);
          poVar9 = std::operator<<(poVar9,'.');
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 0x10 & 0xff);
          poVar9 = std::operator<<(poVar9,'.');
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 8 & 0xff);
          poVar9 = std::operator<<(poVar9,'.');
          std::ostream::operator<<(poVar9,local_218 & 0xff);
        }
        else if (iVar3 == 6) {
          uVar6 = std::ostream::operator<<(local_198,std::hex);
          local_219 = (char)std::setfill<char>('0');
          std::operator<<(uVar6,local_219);
          local_220 = (int)std::setw(2);
          poVar9 = std::operator<<((ostream *)local_198,(_Setw)local_220);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 0x28 & 0xff);
          poVar9 = std::operator<<(poVar9,':');
          local_224 = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_224);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 0x20 & 0xff);
          poVar9 = std::operator<<(poVar9,':');
          local_228 = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_228);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 0x18 & 0xff);
          poVar9 = std::operator<<(poVar9,':');
          local_22c = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_22c);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 0x10 & 0xff);
          poVar9 = std::operator<<(poVar9,':');
          local_230 = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_230);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_218 >> 8 & 0xff);
          poVar9 = std::operator<<(poVar9,':');
          local_234 = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_234);
          std::ostream::operator<<(poVar9,local_218 & 0xff);
        }
        else {
          std::ostream::operator<<(local_198,local_218);
        }
        break;
      case 3:
        if (local_1a0 == (long *)0x0) {
          local_470 = (long *)0x0;
        }
        else {
          local_470 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
        }
        local_208 = local_470;
        bVar2 = (**(code **)(*local_470 + 0x48))(local_470,0,local_1a & 1);
        std::ostream::operator<<(local_198,(bool)(bVar2 & 1));
        break;
      default:
        if ((local_19 & 1) != 0) {
          local_382 = 1;
          piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_380,"Feature of unknown datatype: ",&local_381);
          std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
          std::invalid_argument::invalid_argument(piVar10,local_360);
          local_382 = 0;
          __cxa_throw(piVar10,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        break;
      case 5:
        if (local_1a0 == (long *)0x0) {
          local_598 = (long *)0x0;
        }
        else {
          local_598 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
        }
        local_240 = local_598;
        dVar11 = (double)(**(code **)(*local_598 + 0x48))(local_598,0,local_1a & 1);
        std::ostream::operator<<(local_198,dVar11);
        break;
      case 6:
        if (local_1a0 == (long *)0x0) {
          local_608 = (long *)0x0;
        }
        else {
          local_608 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
        }
        local_2f0 = local_608;
        (**(code **)(*local_608 + 0x48))(local_340,local_608,0,local_1a & 1);
        operator<<(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        GenICam_3_4::gcstring::~gcstring(local_340);
        break;
      case 7:
        if (local_1a0 == (long *)0x0) {
          local_5c8 = (long *)0x0;
        }
        else {
          local_5c8 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
        }
        local_2a0 = local_5c8;
        local_2a8 = (**(code **)(*local_5c8 + 0x48))(local_5c8,0);
        local_2ac = 0x20;
        piVar8 = std::min<int>(&local_2a8,&local_2ac);
        local_2a4 = *piVar8;
        (**(code **)(*local_2a0 + 0x40))(local_2a0,local_2d8,(long)local_2a4,0);
        std::ostream::operator<<(local_198,std::hex);
        for (local_2dc = 0; local_2dc < local_2a4; local_2dc = local_2dc + 1) {
          local_2dd = (char)std::setfill<char>('0');
          poVar9 = std::operator<<(local_198,local_2dd);
          local_2e4 = (int)std::setw(2);
          poVar9 = std::operator<<(poVar9,(_Setw)local_2e4);
          std::ostream::operator<<(poVar9,(uint)local_2d8[local_2dc]);
        }
        break;
      case 9:
        if (local_1a0 == (long *)0x0) {
          local_5b0 = (long *)0x0;
        }
        else {
          local_5b0 = (long *)__dynamic_cast(local_1a0,&GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe)
          ;
        }
        local_248 = local_5b0;
        plVar7 = (long *)(**(code **)(*local_5b0 + 0x78))(local_5b0,0);
        (**(code **)(*plVar7 + 0x40))(local_298);
        operator<<(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        GenICam_3_4::gcstring::~gcstring(local_298);
      }
    }
    else if ((local_19 & 1) != 0) {
      local_3ca = 1;
      piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
      paVar12 = &local_3c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c8,"Feature not readable: ",paVar12);
      std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::invalid_argument::invalid_argument(piVar10,local_3a8);
      local_3ca = 0;
      __cxa_throw(piVar10,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string getString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                      bool exception, bool igncache)
{
  std::ostringstream out;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);
              int64_t value=p->GetValue(false, igncache);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  out << std::hex << value;
                  break;

                case GenApi::IPV4Address:
                   out << ((value>>24)&0xff) << '.' << ((value>>16)&0xff) << '.'
                       << ((value>>8)&0xff) << '.' << (value&0xff);
                   break;

                case GenApi::MACAddress:
                   out << std::hex << std::setfill('0');
                   out << std::setw(2) << ((value>>40)&0xff) << ':'
                       << std::setw(2) << ((value>>32)&0xff) << ':'
                       << std::setw(2) << ((value>>24)&0xff) << ':'
                       << std::setw(2) << ((value>>16)&0xff) << ':'
                       << std::setw(2) << ((value>>8)&0xff) << ':'
                       << std::setw(2) << (value&0xff);
                   break;

                default:
                  out << value;
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              out << p->GetCurrentEntry()->GetSymbolic();
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              int len=std::min(static_cast<int>(p->GetLength()), 32);

              uint8_t buffer[32];
              p->Get(buffer, len);

              out << std::hex;
              for (int i=0; i<len; i++)
              {
                out << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return out.str();
}